

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

const_reference __thiscall
google::protobuf::RepeatedField<long>::Get(RepeatedField<long> *this,int index)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  string *psVar6;
  string *extraout_RAX;
  int *piVar7;
  const_reference plVar8;
  int *piVar9;
  long lVar10;
  bool is_soo;
  LongSooRep *this_00;
  bool is_soo_00;
  bool bVar11;
  LongSooRep LStack_28;
  
  this_00 = &LStack_28;
  lVar10 = (long)index;
  if (index < 0) {
    psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar10,0,"index >= 0");
  }
  else {
    psVar6 = (string *)0x0;
  }
  if (psVar6 == (string *)0x0) {
    iVar2 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < iVar2) {
      psVar6 = (string *)0x0;
    }
    else {
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar10,(long)iVar2,"index < size()");
    }
    if (psVar6 == (string *)0x0) {
      plVar5 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return plVar5 + lVar10;
    }
  }
  else {
    Get();
    psVar6 = extraout_RAX;
  }
  Get();
  uVar1 = this_00->elements_int;
  is_soo_00 = (uVar1 & 4) == 0;
  iVar3 = internal::SooRep::size((SooRep *)this_00,is_soo_00);
  iVar2 = 1;
  if ((uVar1 & 4) == 0) {
    piVar9 = &this_00->size;
  }
  else {
    iVar2 = this_00->capacity;
    piVar9 = (int *)internal::LongSooRep::elements(this_00);
  }
  bVar11 = iVar3 == iVar2;
  if (bVar11) {
    Grow((RepeatedField<long> *)this_00,(uVar1 & 4) == 0,iVar3,iVar3 + 1);
    iVar2 = this_00->capacity;
    piVar9 = (int *)internal::LongSooRep::elements(this_00);
  }
  bVar11 = !bVar11;
  is_soo = bVar11 && is_soo_00;
  iVar3 = iVar3 + 1;
  iVar4 = internal::SooRep::size((SooRep *)this_00,is_soo);
  if ((iVar4 != iVar3) && ((this_00->elements_int & 4) != 0)) {
    internal::LongSooRep::elements(this_00);
  }
  set_size((RepeatedField<long> *)this_00,is_soo,iVar3);
  *(string **)(piVar9 + (long)iVar4 * 2) = psVar6;
  if (is_soo != ((this_00->elements_int & 4) == 0)) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35b);
  }
  iVar4 = internal::SooRep::size((SooRep *)this_00,is_soo);
  if (iVar3 != iVar4) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35d);
  }
  if (bVar11 && is_soo_00) {
    piVar7 = &this_00->size;
  }
  else {
    piVar7 = (int *)internal::LongSooRep::elements(this_00);
  }
  if (piVar9 != piVar7) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35f);
  }
  plVar8 = (const_reference)0x1;
  if (!bVar11 || !is_soo_00) {
    plVar8 = (const_reference)(ulong)(uint)this_00->capacity;
  }
  if (iVar2 != (int)plVar8) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x361);
  }
  return plVar8;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return elements(is_soo())[index];
}